

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  pointer pCVar1;
  ostream *poVar2;
  int in_EAX;
  int extraout_EAX;
  Column *__x;
  pointer text;
  Columns headerCols;
  Column spacer;
  Column local_68;
  
  if (this->m_isOpen == false) {
    this->m_isOpen = true;
    Catch::operator<<(this,__file,___oflag);
    headerCols.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    headerCols.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    headerCols.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TextFlow::Spacer(&spacer,2);
    pCVar1 = (this->m_columnInfos).
             super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (text = (this->m_columnInfos).
                super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; text != pCVar1; text = text + 1) {
      if (text->width < 3) {
        __assert_fail("info.width > 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                      ,0x2172,"void Catch::TablePrinter::open()");
      }
      TextFlow::Column::Column(&local_68,&text->name);
      __x = TextFlow::Column::width(&local_68,text->width - 2);
      std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::push_back
                (&headerCols.m_columns,__x);
      std::__cxx11::string::~string((string *)&local_68);
      std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::push_back
                (&headerCols.m_columns,&spacer);
    }
    poVar2 = this->m_os;
    TextFlow::operator<<(poVar2,&headerCols);
    std::operator<<(poVar2,'\n');
    poVar2 = this->m_os;
    Catch::operator<<(poVar2,(lineOfChars)0x2d);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&spacer);
    std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
              (&headerCols.m_columns);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();

			TextFlow::Columns headerCols;
			auto spacer = TextFlow::Spacer(2);
			for (auto const& info : m_columnInfos) {
                assert(info.width > 2);
				headerCols += TextFlow::Column(info.name).width(info.width - 2);
				headerCols += spacer;
			}
			m_os << headerCols << '\n';

            m_os << lineOfChars('-') << '\n';
        }
    }